

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmProcess.cxx
# Opt level: O3

bool __thiscall cmProcess::Buffer::GetLine(Buffer *this,string *line)

{
  pointer pcVar1;
  char *pcVar2;
  pointer pcVar3;
  ptrdiff_t _Num;
  size_type sVar4;
  long lVar5;
  pointer pcVar6;
  pointer __src;
  
  pcVar6 = (this->super_vector<char,_std::allocator<char>_>).
           super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start;
  pcVar1 = (this->super_vector<char,_std::allocator<char>_>).
           super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
  ;
  sVar4 = this->Last;
  while( true ) {
    if (sVar4 == (long)pcVar1 - (long)pcVar6) {
      if (this->First != 0) {
        __src = pcVar6 + this->First;
        pcVar3 = __src;
        if ((long)pcVar1 - (long)__src != 0) {
          memmove(pcVar6,__src,(long)pcVar1 - (long)__src);
          pcVar1 = (this->super_vector<char,_std::allocator<char>_>).
                   super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                   _M_finish;
          pcVar3 = pcVar1;
        }
        pcVar6 = pcVar6 + ((long)pcVar3 - (long)__src);
        if (pcVar1 != pcVar6) {
          (this->super_vector<char,_std::allocator<char>_>).
          super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
               = pcVar6;
          pcVar1 = pcVar6;
        }
        this->First = 0;
        this->Last = (long)pcVar1 -
                     (long)(this->super_vector<char,_std::allocator<char>_>).
                           super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_start;
      }
      return false;
    }
    if ((pcVar6[sVar4] == '\n') || (pcVar6[sVar4] == '\0')) break;
    sVar4 = sVar4 + 1;
    this->Last = sVar4;
  }
  lVar5 = sVar4 - this->First;
  if (lVar5 != 0) {
    pcVar2 = pcVar6 + sVar4;
    do {
      pcVar2 = pcVar2 + -1;
      if (*pcVar2 != '\r') {
        pcVar2 = (char *)line->_M_string_length;
        goto LAB_00259e43;
      }
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
  }
  pcVar2 = (char *)line->_M_string_length;
LAB_00259e43:
  std::__cxx11::string::_M_replace((ulong)line,0,pcVar2,(ulong)(pcVar6 + this->First));
  sVar4 = this->Last + 1;
  this->Last = sVar4;
  this->First = sVar4;
  return true;
}

Assistant:

bool cmProcess::Buffer::GetLine(std::string& line)
{
  // Scan for the next newline.
  for (size_type sz = this->size(); this->Last != sz; ++this->Last) {
    if ((*this)[this->Last] == '\n' || (*this)[this->Last] == '\0') {
      // Extract the range first..last as a line.
      const char* text = this->data() + this->First;
      size_type length = this->Last - this->First;
      while (length && text[length - 1] == '\r') {
        length--;
      }
      line.assign(text, length);

      // Start a new range for the next line.
      ++this->Last;
      this->First = this->Last;

      // Return the line extracted.
      return true;
    }
  }

  // Available data have been exhausted without a newline.
  if (this->First != 0) {
    // Move the partial line to the beginning of the buffer.
    this->erase(this->begin(), this->begin() + this->First);
    this->First = 0;
    this->Last = this->size();
  }
  return false;
}